

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::UpdateHoveredWindowAndCaptureFlags(void)

{
  ImVec2 *p;
  double *pdVar1;
  double dVar2;
  bool bVar3;
  short sVar4;
  int iVar5;
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  ImVec2 IVar8;
  ImVec2 IVar9;
  ImGuiContext *pIVar10;
  ImGuiWindow *pIVar11;
  undefined1 uVar12;
  uint uVar13;
  byte bVar14;
  ulong uVar15;
  byte bVar16;
  int iVar17;
  char cVar18;
  ulong uVar19;
  char cVar20;
  ImGuiContext *g;
  ImGuiWindow *pIVar21;
  byte bVar22;
  bool bVar23;
  float fVar24;
  float fVar27;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  ImGuiWindow *local_90;
  ImRect local_88;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  ImRect local_40;
  
  pIVar10 = GImGui;
  local_58._8_8_ = 0;
  local_58._0_4_ = (GImGui->Style).TouchExtraPadding.x;
  local_58._4_4_ = (GImGui->Style).TouchExtraPadding.y;
  local_68 = maxps(local_58,_DAT_0022ebd0);
  GImGui->WindowsHoverPadding = local_68._0_8_;
  pIVar11 = pIVar10->MovingWindow;
  pIVar21 = (ImGuiWindow *)0x0;
  if ((pIVar11 != (ImGuiWindow *)0x0) && ((pIVar11->Flags & 0x200) == 0)) {
    pIVar21 = pIVar11;
  }
  uVar15 = (ulong)(uint)(pIVar10->Windows).Size;
  p = &(pIVar10->IO).MousePos;
  bVar23 = (pIVar10->IO).ConfigWindowsResizeFromEdges;
  local_78._1_3_ = 0;
  local_78[0] = bVar23;
  local_90 = (ImGuiWindow *)0x0;
  local_78[4] = bVar23;
  local_78._5_3_ = 0;
  local_78[8] = bVar23;
  local_78._9_7_ = 0;
LAB_001c7276:
  uVar19 = uVar15 & 0xffffffff;
  do {
    uVar15 = uVar15 - 1;
    if ((int)uVar19 < 1) goto LAB_001c73ec;
    pIVar11 = (pIVar10->Windows).Data[uVar15];
    if (((pIVar11->Active == true) && (pIVar11->Hidden == false)) && ((pIVar11->Flags & 0x200) == 0)
       ) {
      IVar8 = (pIVar11->OuterRectClipped).Min;
      IVar9 = (pIVar11->OuterRectClipped).Max;
      bVar23 = (pIVar11->Flags & 0x1000042U) == 0;
      auVar25._1_3_ = 0;
      auVar25[0] = bVar23;
      auVar25[4] = bVar23;
      auVar25._5_3_ = 0;
      auVar25[8] = bVar23;
      auVar25._9_7_ = 0;
      auVar25 = auVar25 & local_78;
      auVar26._0_4_ = (auVar25._0_4_ << 0x1f) >> 0x1f;
      auVar26._4_4_ = (auVar25._4_4_ << 0x1f) >> 0x1f;
      auVar26._8_4_ = (auVar25._8_4_ << 0x1f) >> 0x1f;
      auVar26._12_4_ = (auVar25._12_4_ << 0x1f) >> 0x1f;
      auVar25 = ~auVar26 & local_58 | local_68 & auVar26;
      fVar24 = auVar25._0_4_;
      fVar27 = auVar25._4_4_;
      auVar6._4_8_ = SUB168(local_68 & auVar26,8);
      auVar6._0_4_ = fVar27;
      auVar28._0_8_ = auVar6._0_8_ << 0x20;
      auVar28._8_4_ = fVar24;
      auVar28._12_4_ = fVar27;
      local_88.Min.x = IVar8.x;
      local_88.Min.y = IVar8.y;
      local_88.Max.x = IVar9.x;
      local_88.Max.y = IVar9.y;
      auVar7._4_8_ = auVar28._8_8_;
      auVar7._0_4_ = fVar27 + local_88.Min.y;
      auVar29._0_8_ = auVar7._0_8_ << 0x20;
      auVar29._8_4_ = fVar24 + local_88.Max.x;
      auVar29._12_4_ = fVar27 + local_88.Max.y;
      local_88.Max = auVar29._8_8_;
      local_88.Min.y = local_88.Min.y - fVar27;
      local_88.Min.x = local_88.Min.x - fVar24;
      bVar23 = ImRect::Contains(&local_88,p);
      if (!bVar23) goto LAB_001c7276;
      sVar4 = (pIVar11->HitTestHoleSize).x;
      if (sVar4 == 0) break;
      auVar25 = pshuflw(ZEXT416((uint)pIVar11->HitTestHoleOffset),
                        ZEXT416((uint)pIVar11->HitTestHoleOffset),0x60);
      local_40.Min.x = (float)(auVar25._0_4_ >> 0x10) + (pIVar11->Pos).x;
      local_40.Min.y = (float)(auVar25._4_4_ >> 0x10) + (pIVar11->Pos).y;
      local_40.Max.x = (float)(int)sVar4 + local_40.Min.x;
      local_40.Max.y =
           (float)(int)((long)((ulong)(ushort)(pIVar11->HitTestHoleSize).y << 0x30) >> 0x30) +
           local_40.Min.y;
      bVar23 = ImRect::Contains(&local_40,p);
      if (!bVar23) break;
    }
    uVar19 = (ulong)((int)uVar19 - 1);
  } while( true );
  if (pIVar21 == (ImGuiWindow *)0x0) {
    pIVar21 = pIVar11;
  }
  if (((local_90 == (ImGuiWindow *)0x0) &&
      (local_90 = pIVar11, pIVar10->MovingWindow != (ImGuiWindow *)0x0)) &&
     (pIVar11->RootWindow == pIVar10->MovingWindow->RootWindow)) {
    local_90 = (ImGuiWindow *)0x0;
  }
  else {
    if (pIVar21 != (ImGuiWindow *)0x0) {
LAB_001c73ec:
      pIVar10->HoveredWindow = pIVar21;
      pIVar10->HoveredWindowUnderMovingWindow = local_90;
      pIVar11 = GetTopMostPopupModal();
      bVar23 = false;
      if ((pIVar11 != (ImGuiWindow *)0x0) && (bVar23 = false, pIVar21 != (ImGuiWindow *)0x0)) {
        bVar23 = IsWindowWithinBeginStackOf(pIVar21->RootWindow,pIVar11);
        bVar23 = !bVar23;
      }
      uVar13 = (pIVar10->IO).ConfigFlags;
      iVar5 = (pIVar10->OpenPopupStack).Size;
      uVar15 = 0xffffffffffffffff;
      uVar19 = 0;
      bVar16 = 0;
      while( true ) {
        iVar17 = (int)uVar15;
        if (uVar19 == 5) break;
        if ((pIVar10->IO).MouseClicked[uVar19] == true) {
          (pIVar10->IO).MouseDownOwned[uVar19] =
               pIVar10->HoveredWindow != (ImGuiWindow *)0x0 || 0 < iVar5;
          (pIVar10->IO).MouseDownOwnedUnlessPopupClose[uVar19] =
               pIVar10->HoveredWindow != (ImGuiWindow *)0x0 || pIVar11 != (ImGuiWindow *)0x0;
        }
        bVar3 = (pIVar10->IO).MouseDown[uVar19];
        if ((bVar3 == true) &&
           ((iVar17 == -1 ||
            (dVar2 = (pIVar10->IO).MouseClickedTime[iVar17],
            pdVar1 = (pIVar10->IO).MouseClickedTime + uVar19, *pdVar1 <= dVar2 && dVar2 != *pdVar1))
           )) {
          uVar15 = uVar19 & 0xffffffff;
        }
        bVar16 = bVar16 & 1 | bVar3;
        uVar19 = uVar19 + 1;
      }
      bVar22 = 1;
      cVar20 = '\x01';
      cVar18 = '\x01';
      if (iVar17 != -1) {
        cVar20 = (pIVar10->IO).MouseDownOwned[iVar17];
        cVar18 = (pIVar10->IO).MouseDownOwnedUnlessPopupClose[iVar17];
      }
      bVar14 = (byte)((uVar13 & 0x10) >> 4) | bVar23;
      if (pIVar10->DragDropActive == true) {
        bVar22 = (pIVar10->DragDropSourceFlags & 0x10U) == 0 | bVar14;
      }
      if (cVar20 != '\0') {
        bVar22 = bVar14;
      }
      if (bVar22 != 0) {
        pIVar10->HoveredWindow = (ImGuiWindow *)0x0;
        pIVar10->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
      }
      iVar17 = pIVar10->WantCaptureMouseNextFrame;
      if (iVar17 == -1) {
        if ((cVar20 == '\0') ||
           (bVar23 = true, pIVar10->HoveredWindow == (ImGuiWindow *)0x0 && (bVar16 & 1) == 0)) {
          bVar23 = 0 < iVar5;
        }
        (pIVar10->IO).WantCaptureMouse = bVar23;
        if ((cVar18 == '\0') ||
           (bVar23 = true, pIVar10->HoveredWindow == (ImGuiWindow *)0x0 && (bVar16 & 1) == 0)) {
          bVar23 = pIVar11 != (ImGuiWindow *)0x0;
        }
        (pIVar10->IO).WantCaptureMouseUnlessPopupClose = bVar23;
      }
      else {
        (pIVar10->IO).WantCaptureMouseUnlessPopupClose = iVar17 != 0;
        (pIVar10->IO).WantCaptureMouse = iVar17 != 0;
      }
      if (pIVar10->WantCaptureKeyboardNextFrame == -1) {
        bVar23 = pIVar10->ActiveId != 0 || pIVar11 != (ImGuiWindow *)0x0;
      }
      else {
        bVar23 = pIVar10->WantCaptureKeyboardNextFrame != 0;
      }
      uVar13 = uVar13 & 9;
      uVar12 = (char)uVar13;
      if (uVar13 != 1) {
        uVar12 = bVar23;
      }
      if ((pIVar10->IO).NavActive == false) {
        uVar12 = bVar23;
      }
      (pIVar10->IO).WantCaptureKeyboard = (bool)uVar12;
      (pIVar10->IO).WantTextInput = pIVar10->WantTextInputNextFrame - 1U < 0xfffffffe;
      return;
    }
    pIVar21 = (ImGuiWindow *)0x0;
  }
  goto LAB_001c7276;
}

Assistant:

void ImGui::UpdateHoveredWindowAndCaptureFlags()
{
    ImGuiContext& g = *GImGui;
    ImGuiIO& io = g.IO;
    g.WindowsHoverPadding = ImMax(g.Style.TouchExtraPadding, ImVec2(WINDOWS_HOVER_PADDING, WINDOWS_HOVER_PADDING));

    // Find the window hovered by mouse:
    // - Child windows can extend beyond the limit of their parent so we need to derive HoveredRootWindow from HoveredWindow.
    // - When moving a window we can skip the search, which also conveniently bypasses the fact that window->WindowRectClipped is lagging as this point of the frame.
    // - We also support the moved window toggling the NoInputs flag after moving has started in order to be able to detect windows below it, which is useful for e.g. docking mechanisms.
    bool clear_hovered_windows = false;
    FindHoveredWindow();

    // Modal windows prevents mouse from hovering behind them.
    ImGuiWindow* modal_window = GetTopMostPopupModal();
    if (modal_window && g.HoveredWindow && !IsWindowWithinBeginStackOf(g.HoveredWindow->RootWindow, modal_window))
        clear_hovered_windows = true;

    // Disabled mouse?
    if (io.ConfigFlags & ImGuiConfigFlags_NoMouse)
        clear_hovered_windows = true;

    // We track click ownership. When clicked outside of a window the click is owned by the application and
    // won't report hovering nor request capture even while dragging over our windows afterward.
    const bool has_open_popup = (g.OpenPopupStack.Size > 0);
    const bool has_open_modal = (modal_window != NULL);
    int mouse_earliest_down = -1;
    bool mouse_any_down = false;
    for (int i = 0; i < IM_ARRAYSIZE(io.MouseDown); i++)
    {
        if (io.MouseClicked[i])
        {
            io.MouseDownOwned[i] = (g.HoveredWindow != NULL) || has_open_popup;
            io.MouseDownOwnedUnlessPopupClose[i] = (g.HoveredWindow != NULL) || has_open_modal;
        }
        mouse_any_down |= io.MouseDown[i];
        if (io.MouseDown[i])
            if (mouse_earliest_down == -1 || io.MouseClickedTime[i] < io.MouseClickedTime[mouse_earliest_down])
                mouse_earliest_down = i;
    }
    const bool mouse_avail = (mouse_earliest_down == -1) || io.MouseDownOwned[mouse_earliest_down];
    const bool mouse_avail_unless_popup_close = (mouse_earliest_down == -1) || io.MouseDownOwnedUnlessPopupClose[mouse_earliest_down];

    // If mouse was first clicked outside of ImGui bounds we also cancel out hovering.
    // FIXME: For patterns of drag and drop across OS windows, we may need to rework/remove this test (first committed 311c0ca9 on 2015/02)
    const bool mouse_dragging_extern_payload = g.DragDropActive && (g.DragDropSourceFlags & ImGuiDragDropFlags_SourceExtern) != 0;
    if (!mouse_avail && !mouse_dragging_extern_payload)
        clear_hovered_windows = true;

    if (clear_hovered_windows)
        g.HoveredWindow = g.HoveredWindowUnderMovingWindow = NULL;

    // Update io.WantCaptureMouse for the user application (true = dispatch mouse info to Dear ImGui only, false = dispatch mouse to Dear ImGui + underlying app)
    // Update io.WantCaptureMouseAllowPopupClose (experimental) to give a chance for app to react to popup closure with a drag
    if (g.WantCaptureMouseNextFrame != -1)
    {
        io.WantCaptureMouse = io.WantCaptureMouseUnlessPopupClose = (g.WantCaptureMouseNextFrame != 0);
    }
    else
    {
        io.WantCaptureMouse = (mouse_avail && (g.HoveredWindow != NULL || mouse_any_down)) || has_open_popup;
        io.WantCaptureMouseUnlessPopupClose = (mouse_avail_unless_popup_close && (g.HoveredWindow != NULL || mouse_any_down)) || has_open_modal;
    }

    // Update io.WantCaptureKeyboard for the user application (true = dispatch keyboard info to Dear ImGui only, false = dispatch keyboard info to Dear ImGui + underlying app)
    if (g.WantCaptureKeyboardNextFrame != -1)
        io.WantCaptureKeyboard = (g.WantCaptureKeyboardNextFrame != 0);
    else
        io.WantCaptureKeyboard = (g.ActiveId != 0) || (modal_window != NULL);
    if (io.NavActive && (io.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard) && !(io.ConfigFlags & ImGuiConfigFlags_NavNoCaptureKeyboard))
        io.WantCaptureKeyboard = true;

    // Update io.WantTextInput flag, this is to allow systems without a keyboard (e.g. mobile, hand-held) to show a software keyboard if possible
    io.WantTextInput = (g.WantTextInputNextFrame != -1) ? (g.WantTextInputNextFrame != 0) : false;
}